

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_12::NameApplier::UseNameForParamAndLocalVar
          (NameApplier *this,Func *func,Var *var)

{
  string_view name_00;
  bool bVar1;
  __type _Var2;
  Index IVar3;
  Index IVar4;
  reference pvVar5;
  string *__rhs;
  ulong uVar6;
  undefined1 local_50 [8];
  string name;
  Index local_index;
  Var *var_local;
  Func *func_local;
  NameApplier *this_local;
  
  IVar3 = Func::GetLocalIndex(func,var);
  name.field_2._12_4_ = IVar3;
  IVar4 = Func::GetNumParamsAndLocals(func);
  if (IVar3 < IVar4) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->param_and_local_index_to_name_,(ulong)(uint)name.field_2._12_4_);
    std::__cxx11::string::string((string *)local_50,(string *)pvVar5);
    bVar1 = Var::is_name(var);
    if (bVar1) {
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,__rhs);
      if (!_Var2) {
        __assert_fail("name == var->name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/apply-names.cc"
                      ,0xe6,
                      "Result wabt::(anonymous namespace)::NameApplier::UseNameForParamAndLocalVar(Func *, Var *)"
                     );
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        name_00 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        Var::set_name(var,name_00);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::UseNameForParamAndLocalVar(Func* func, Var* var) {
  Index local_index = func->GetLocalIndex(*var);
  if (local_index >= func->GetNumParamsAndLocals()) {
    return Result::Error;
  }

  std::string name = param_and_local_index_to_name_[local_index];
  if (var->is_name()) {
    assert(name == var->name());
    return Result::Ok;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
  return Result::Ok;
}